

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sam.c
# Opt level: O0

bam_hdr_t * sam_hdr_parse(int l_text,char *text)

{
  int iVar1;
  long lVar2;
  bam_hdr_t *pbVar3;
  bool bVar4;
  int local_4c;
  khint_t local_48;
  int absent;
  khint_t k;
  int ln;
  char *sn;
  kh_s2i_t *d;
  char *p;
  char *r;
  char *q;
  char *text_local;
  int l_text_local;
  
  q = text;
  text_local._4_4_ = l_text;
  sn = (char *)kh_init_s2i();
  for (d = (kh_s2i_t *)q; (char)d->n_buckets != '\0'; d = (kh_s2i_t *)((long)&d->n_buckets + 1)) {
    iVar1 = strncmp((char *)d,"@SQ",3);
    if (iVar1 == 0) {
      _k = (kh_cstr_t)0x0;
      absent = -1;
      r = (char *)&d->size;
      while( true ) {
        iVar1 = strncmp(r,"SN:",3);
        if (iVar1 == 0) {
          r = r + 3;
          p = r;
          while( true ) {
            bVar4 = false;
            if (*p != '\t') {
              bVar4 = *p != '\n';
            }
            if (!bVar4) break;
            p = p + 1;
          }
          _k = (char *)calloc((size_t)(p + (1 - (long)r)),1);
          strncpy(_k,r,(long)p - (long)r);
          r = p;
        }
        else {
          iVar1 = strncmp(r,"LN:",3);
          if (iVar1 == 0) {
            lVar2 = strtol(r + 3,&r,10);
            absent = (int)lVar2;
          }
        }
        while( true ) {
          bVar4 = false;
          if (*r != '\t') {
            bVar4 = *r != '\n';
          }
          if (!bVar4) break;
          r = r + 1;
        }
        if (*r == '\n') break;
        r = r + 1;
      }
      d = (kh_s2i_t *)r;
      if ((_k != (kh_cstr_t)0x0) && (-1 < absent)) {
        local_48 = kh_put_s2i((kh_s2i_t *)sn,_k,&local_4c);
        if (local_4c == 0) {
          if (1 < hts_verbose) {
            fprintf(_stderr,"[W::%s] duplicated sequence \'%s\'\n","sam_hdr_parse",_k);
          }
          free(_k);
        }
        else {
          *(ulong *)(*(long *)(sn + 0x20) + (ulong)local_48 * 8) =
               (ulong)(*(int *)(sn + 4) - 1) << 0x20 | (long)absent;
        }
      }
    }
    for (; (char)d->n_buckets != '\n'; d = (kh_s2i_t *)((long)&d->n_buckets + 1)) {
    }
  }
  pbVar3 = hdr_from_dict((sdict_t *)sn);
  return pbVar3;
}

Assistant:

bam_hdr_t *sam_hdr_parse(int l_text, const char *text)
{
    const char *q, *r, *p;
    khash_t(s2i) *d;
    d = kh_init(s2i);
    for (p = text; *p; ++p) {
        if (strncmp(p, "@SQ", 3) == 0) {
            char *sn = 0;
            int ln = -1;
            for (q = p + 4;; ++q) {
                if (strncmp(q, "SN:", 3) == 0) {
                    q += 3;
                    for (r = q; *r != '\t' && *r != '\n'; ++r);
                    sn = (char*)calloc(r - q + 1, 1);
                    strncpy(sn, q, r - q);
                    q = r;
                } else if (strncmp(q, "LN:", 3) == 0)
                    ln = strtol(q + 3, (char**)&q, 10);
                while (*q != '\t' && *q != '\n') ++q;
                if (*q == '\n') break;
            }
            p = q;
            if (sn && ln >= 0) {
                khint_t k;
                int absent;
                k = kh_put(s2i, d, sn, &absent);
                if (!absent) {
                    if (hts_verbose >= 2)
                        fprintf(stderr, "[W::%s] duplicated sequence '%s'\n", __func__, sn);
                    free(sn);
                } else kh_val(d, k) = (int64_t)(kh_size(d) - 1)<<32 | ln;
            }
        }
        while (*p != '\n') ++p;
    }
    return hdr_from_dict(d);
}